

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

void __thiscall
Importer_warningCircularImportReferencesUnits_Test::
~Importer_warningCircularImportReferencesUnits_Test
          (Importer_warningCircularImportReferencesUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, warningCircularImportReferencesUnits)
{
    const std::string errorMessage =
        std::string("Cyclic dependencies were found when attempting to resolve units in the model 'circularImport1'. The dependency loop is:\n")
        + " - units 'i_am_cyclic' specifies an import from ':this:' to '" + resourcePath("importer/") + "circularUnits_2.cellml';\n"
        + " - units 'u2' specifies an import from '" + resourcePath("importer/") + "circularUnits_2.cellml' to '" + resourcePath("importer/") + "circularUnits_3.cellml'; and\n"
        + " - units 'u3' specifies an import from '" + resourcePath("importer/") + "circularUnits_3.cellml' to '" + resourcePath("importer/") + "circularUnits_1.cellml'.";

    auto parser = libcellml::Parser::create();
    auto importer = libcellml::Importer::create();
    auto model = parser->parseModel(fileContents("importer/circularUnits_1.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(size_t(1), importer->errorCount());
    EXPECT_EQ(errorMessage, importer->error(0)->description());
}